

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

IndexVector * __thiscall
Centaurus::NFABaseState<unsigned_char,_int>::epsilon_transitions
          (IndexVector *__return_storage_ptr__,NFABaseState<unsigned_char,_int> *this,
          bool *long_flag)

{
  pointer pNVar1;
  iterator __position;
  undefined8 in_RAX;
  NFATransition<unsigned_char> *i;
  pointer pNVar2;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  __return_storage_ptr__->_vptr_IndexVector = (_func_int **)&PTR__IndexVector_0019ef10;
  pNVar2 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar2 != pNVar1) {
    uStack_38 = in_RAX;
    do {
      if ((pNVar2->m_label).m_ranges.
          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (pNVar2->m_label).m_ranges.
          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uStack_38 = CONCAT44(pNVar2->m_dest,(undefined4)uStack_38);
        __position._M_current =
             (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (__position._M_current ==
            (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,__position,
                     (int *)((long)&uStack_38 + 4));
        }
        else {
          *__position._M_current = pNVar2->m_dest;
          (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               __position._M_current + 1;
        }
      }
      if (pNVar2->m_long == true) {
        *long_flag = true;
      }
      pNVar2 = pNVar2 + 1;
    } while (pNVar2 != pNVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector epsilon_transitions(bool& long_flag) const
    {
        IndexVector ret;

        for (const auto& i : m_transitions)
        {
            if (i.is_epsilon())
            {
                ret.push_back(i.dest());
            }
            if (i.is_long())
            {
                long_flag = true;
            }
        }

        return ret;
    }